

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O1

void Gia_ManPrintStats(Gia_Man_t *p,Gps_Par_t *pPars)

{
  int iVar1;
  int iVar2;
  int *__ptr;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  char *pcVar11;
  ulong uVar12;
  long lVar13;
  int level;
  int iVar14;
  Gia_Man_t *pGVar15;
  float fVar16;
  double dVar17;
  
  if ((pPars != (Gps_Par_t *)0x0) && (pPars->fMiter != 0)) {
    Gia_ManPrintStatsMiter(p,(int)pPars);
    return;
  }
  if (p->pName != (char *)0x0) {
    Abc_Print((int)p,"%s%-8s%s : ","\x1b[1;37m",p->pName,"\x1b[0m");
  }
  iVar8 = p->vCis->nSize;
  iVar14 = p->nRegs;
  iVar4 = Gia_ManBoxCiNum(p);
  iVar5 = Gia_ManRegBoxNum(p);
  iVar1 = p->vCos->nSize;
  iVar2 = p->nRegs;
  iVar6 = Gia_ManBoxCoNum(p);
  pGVar15 = p;
  iVar7 = Gia_ManRegBoxNum(p);
  level = (int)pGVar15;
  Abc_Print(level,"i/o =%7d/%7d",(ulong)(uint)(iVar8 - (iVar5 + iVar4 + iVar14)),
            (ulong)(uint)(iVar1 - (iVar7 + iVar6 + iVar2)));
  if (p->nConstrs != 0) {
    Abc_Print(level,"(c=%d)");
  }
  if (p->nRegs != 0) {
    Abc_Print(level,"  ff =%7d");
  }
  pGVar15 = p;
  iVar8 = Gia_ManRegBoxNum(p);
  iVar14 = (int)pGVar15;
  if (iVar8 != 0) {
    uVar9 = Gia_ManRegBoxNum(p);
    pGVar15 = p;
    uVar10 = Gia_ManClockDomainNum(p);
    iVar14 = (int)pGVar15;
    Abc_Print(iVar14,"  boxff =%d(%d)",(ulong)uVar9,(ulong)uVar10);
  }
  pcVar11 = "nod";
  if (p->pMuxes == (uint *)0x0) {
    pcVar11 = "and";
  }
  Abc_Print(iVar14,"  %s%s =%8d%s","\x1b[1;36m",pcVar11,
            (ulong)(uint)(~(p->vCos->nSize + p->vCis->nSize) + p->nObjs),"\x1b[0m");
  pGVar15 = p;
  uVar9 = Gia_ManLevelNum(p);
  Abc_Print((int)pGVar15,"  %slev =%5d%s","\x1b[1;35m",(ulong)uVar9,"\x1b[0m");
  pGVar15 = p;
  fVar16 = Gia_ManLevelAve(p);
  Abc_Print((int)pGVar15," %s(%.2f)%s",(double)fVar16,"\x1b[1;35m");
  if (p->vLevels != (Vec_Int_t *)0x0) {
    __ptr = p->vLevels->pArray;
    if (__ptr != (int *)0x0) {
      free(__ptr);
      p->vLevels->pArray = (int *)0x0;
    }
    if (p->vLevels != (Vec_Int_t *)0x0) {
      free(p->vLevels);
      p->vLevels = (Vec_Int_t *)0x0;
    }
  }
  if ((pPars != (Gps_Par_t *)0x0) && (pPars->fCut != 0)) {
    uVar9 = Gia_ManCrossCut(p,0);
    pGVar15 = p;
    Gia_ManCrossCut(p,1);
    Abc_Print((int)pGVar15,"  cut = %d(%d)",(ulong)uVar9);
  }
  pGVar15 = p;
  dVar17 = Gia_ManMemory(p);
  uVar9 = (uint)pGVar15;
  Abc_Print(uVar9,"  mem =%5.2f MB",dVar17 * 9.5367431640625e-07);
  if (p->pSibls != (int *)0x0) {
    if ((long)p->nObjs < 1) {
      uVar12 = 0;
    }
    else {
      lVar13 = 0;
      uVar12 = 0;
      do {
        bVar3 = 0 < p->pSibls[lVar13];
        uVar9 = (uint)bVar3;
        uVar12 = (ulong)((int)uVar12 + (uint)bVar3);
        lVar13 = lVar13 + 1;
      } while (p->nObjs != lVar13);
    }
    Abc_Print(uVar9,"  ch =%5d",uVar12);
  }
  if (p->pManTime != (void *)0x0) {
    pGVar15 = p;
    uVar10 = Gia_ManNonRegBoxNum(p);
    uVar9 = (uint)pGVar15;
    Abc_Print(uVar9,"  box = %d",(ulong)uVar10);
  }
  if (p->pManTime != (void *)0x0) {
    pGVar15 = p;
    uVar10 = Gia_ManBlackBoxNum(p);
    uVar9 = (uint)pGVar15;
    Abc_Print(uVar9,"  bb = %d",(ulong)uVar10);
  }
  if (p->nBufs != 0) {
    Abc_Print(uVar9,"  buf = %d");
  }
  if (pPars != (Gps_Par_t *)0x0) {
    if (pPars->fMuxXor != 0) {
      printf("\nXOR/MUX ");
      pGVar15 = p;
      Gia_ManPrintMuxStats(p);
      uVar9 = (uint)pGVar15;
    }
    if (pPars->fSwitch != 0) {
      pGVar15 = p;
      fVar16 = Gia_ManComputeSwitching(p,0x30,0x10,0);
      uVar9 = (uint)pGVar15;
      Abc_Print(uVar9,"  power =%8.1f",(double)fVar16);
      if ((Gia_ManPrintStats::PrevSwiTotal <= 0.0) ||
         (Gia_ManPrintStats::nPiPo != p->vCos->nSize + p->vCis->nSize)) {
        if (((Gia_ManPrintStats::PrevSwiTotal == 0.0) && (!NAN(Gia_ManPrintStats::PrevSwiTotal))) ||
           (Gia_ManPrintStats::nPiPo != p->vCos->nSize + p->vCis->nSize)) {
          Gia_ManPrintStats::nPiPo = p->vCos->nSize + p->vCis->nSize;
          Gia_ManPrintStats::PrevSwiTotal = fVar16;
        }
      }
      else {
        Abc_Print(uVar9," %6.2f %%",
                  ((double)(Gia_ManPrintStats::PrevSwiTotal - fVar16) * 100.0) /
                  (double)Gia_ManPrintStats::PrevSwiTotal);
      }
    }
  }
  Abc_Print(uVar9,"\n");
  if ((p->pReprs != (Gia_Rpr_t *)0x0) && (p->pNexts != (int *)0x0)) {
    Gia_ManEquivPrintClasses(p,0,0.0);
  }
  if (p->vMapping == (Vec_Int_t *)0x0) goto LAB_006e7f47;
  if (pPars == (Gps_Par_t *)0x0) {
LAB_006e7f3d:
    pcVar11 = (char *)0x0;
  }
  else {
    if (pPars->fSkipMap != 0) goto LAB_006e7f47;
    if (pPars == (Gps_Par_t *)0x0) goto LAB_006e7f3d;
    pcVar11 = pPars->pDumpFile;
  }
  Gia_ManPrintMappingStats(p,pcVar11);
LAB_006e7f47:
  if ((((pPars != (Gps_Par_t *)0x0) && (pPars->fNpn != 0)) && (p->vMapping != (Vec_Int_t *)0x0)) &&
     (iVar8 = Gia_ManLutSizeMax(p), iVar8 < 5)) {
    Gia_ManPrintNpnClasses(p);
  }
  if (p->vPacking != (Vec_Int_t *)0x0) {
    Gia_ManPrintPackingStats(p);
  }
  if (((pPars != (Gps_Par_t *)0x0) && (pPars->fLutProf != 0)) && (p->vMapping != (Vec_Int_t *)0x0))
  {
    Gia_ManPrintLutStats(p);
  }
  if (p->pPlacement != (Gia_Plc_t *)0x0) {
    Gia_ManPrintPlacement(p);
  }
  Gia_ManPrintFlopClasses(p);
  Gia_ManPrintGateClasses(p);
  Gia_ManPrintObjClasses(p);
  if (p->vInitClasses != (Vec_Int_t *)0x0) {
    Gia_ManPrintInitClasses(p->vInitClasses);
  }
  Gia_ManCheckIntegrityWithBoxes(p);
  if ((pPars != (Gps_Par_t *)0x0) && (pPars->fTents != 0)) {
    Gia_ManPrintTents(p);
    return;
  }
  return;
}

Assistant:

void Gia_ManPrintStats( Gia_Man_t * p, Gps_Par_t * pPars )
{
    extern float Gia_ManLevelAve( Gia_Man_t * p );
    if ( pPars && pPars->fMiter )
    {
        Gia_ManPrintStatsMiter( p, 0 );
        return;
    }
#ifdef WIN32
    SetConsoleTextAttribute( GetStdHandle(STD_OUTPUT_HANDLE), 15 ); // bright
    if ( p->pName )
        Abc_Print( 1, "%-8s : ", p->pName );
    SetConsoleTextAttribute( GetStdHandle(STD_OUTPUT_HANDLE), 7 );  // normal
#else
    if ( p->pName )
        Abc_Print( 1, "%s%-8s%s : ", "\033[1;37m", p->pName, "\033[0m" );  // bright
#endif
    Abc_Print( 1, "i/o =%7d/%7d", 
        Gia_ManPiNum(p) - Gia_ManBoxCiNum(p) - Gia_ManRegBoxNum(p), 
        Gia_ManPoNum(p) - Gia_ManBoxCoNum(p) - Gia_ManRegBoxNum(p) );
    if ( Gia_ManConstrNum(p) )
        Abc_Print( 1, "(c=%d)", Gia_ManConstrNum(p) );
    if ( Gia_ManRegNum(p) )
        Abc_Print( 1, "  ff =%7d", Gia_ManRegNum(p) );
    if ( Gia_ManRegBoxNum(p) )
        Abc_Print( 1, "  boxff =%d(%d)", Gia_ManRegBoxNum(p), Gia_ManClockDomainNum(p) );

#ifdef WIN32
    {
    HANDLE hConsole = GetStdHandle(STD_OUTPUT_HANDLE);
    SetConsoleTextAttribute( hConsole, 11 ); // blue
    Abc_Print( 1, "  %s =%8d", p->pMuxes? "nod" : "and", Gia_ManAndNum(p) );
    SetConsoleTextAttribute( hConsole, 13 ); // magenta
    Abc_Print( 1, "  lev =%5d", Gia_ManLevelNum(p) ); 
    Abc_Print( 1, " (%.2f)", Gia_ManLevelAve(p) ); 
    SetConsoleTextAttribute( hConsole, 7 ); // normal
    }
#else
    Abc_Print( 1, "  %s%s =%8d%s",  "\033[1;36m", p->pMuxes? "nod" : "and", Gia_ManAndNum(p), "\033[0m" ); // blue
    Abc_Print( 1, "  %slev =%5d%s", "\033[1;35m", Gia_ManLevelNum(p), "\033[0m" ); // magenta
    Abc_Print( 1, " %s(%.2f)%s",    "\033[1;35m", Gia_ManLevelAve(p), "\033[0m" ); 
#endif
    Vec_IntFreeP( &p->vLevels );
    if ( pPars && pPars->fCut )
        Abc_Print( 1, "  cut = %d(%d)", Gia_ManCrossCut(p, 0), Gia_ManCrossCut(p, 1) );
    Abc_Print( 1, "  mem =%5.2f MB", Gia_ManMemory(p)/(1<<20) );
    if ( Gia_ManHasChoices(p) )
        Abc_Print( 1, "  ch =%5d", Gia_ManChoiceNum(p) );
	if ( p->pManTime )
		Abc_Print( 1, "  box = %d", Gia_ManNonRegBoxNum(p) );
	if ( p->pManTime )
		Abc_Print( 1, "  bb = %d", Gia_ManBlackBoxNum(p) );
    if ( Gia_ManBufNum(p) )
		Abc_Print( 1, "  buf = %d", Gia_ManBufNum(p) );
    if ( pPars && pPars->fMuxXor )
        printf( "\nXOR/MUX " ), Gia_ManPrintMuxStats( p );
    if ( pPars && pPars->fSwitch )
    {
        static int nPiPo = 0;
        static float PrevSwiTotal = 0;
        float SwiTotal = Gia_ManComputeSwitching( p, 48, 16, 0 );
        Abc_Print( 1, "  power =%8.1f", SwiTotal );
        if ( PrevSwiTotal > 0 && nPiPo == Gia_ManCiNum(p) + Gia_ManCoNum(p) )
            Abc_Print( 1, " %6.2f %%", 100.0*(PrevSwiTotal-SwiTotal)/PrevSwiTotal );
        else if ( PrevSwiTotal == 0 || nPiPo != Gia_ManCiNum(p) + Gia_ManCoNum(p) )
            PrevSwiTotal = SwiTotal, nPiPo = Gia_ManCiNum(p) + Gia_ManCoNum(p);
    }
//    Abc_Print( 1, "obj =%5d  ", Gia_ManObjNum(p) );
    Abc_Print( 1, "\n" );

//    Gia_ManSatExperiment( p );
    if ( p->pReprs && p->pNexts )
        Gia_ManEquivPrintClasses( p, 0, 0.0 );
    if ( Gia_ManHasMapping(p) && (pPars == NULL || !pPars->fSkipMap) )
        Gia_ManPrintMappingStats( p, pPars ? pPars->pDumpFile : NULL );
    if ( pPars && pPars->fNpn && Gia_ManHasMapping(p) && Gia_ManLutSizeMax(p) <= 4 )
        Gia_ManPrintNpnClasses( p );
    if ( p->vPacking )
        Gia_ManPrintPackingStats( p );
    if ( pPars && pPars->fLutProf && Gia_ManHasMapping(p) )
        Gia_ManPrintLutStats( p );
    if ( p->pPlacement )
        Gia_ManPrintPlacement( p );
//    if ( p->pManTime )
//        Tim_ManPrintStats( (Tim_Man_t *)p->pManTime, p->nAnd2Delay );
    Gia_ManPrintFlopClasses( p );
    Gia_ManPrintGateClasses( p );
    Gia_ManPrintObjClasses( p );
//    if ( p->vRegClasses )
//    {
//        printf( "The design has %d flops with the following class info: ", Vec_IntSize(p->vRegClasses) );
//        Vec_IntPrint( p->vRegClasses );
//    }
    if ( p->vInitClasses )
        Gia_ManPrintInitClasses( p->vInitClasses );
    // check integrity of boxes
    Gia_ManCheckIntegrityWithBoxes( p );
/*
    if ( Gia_ManRegBoxNum(p) )
    {
        int i, Limit = Vec_IntFindMax(p->vRegClasses);
        for ( i = 1; i <= Limit; i++ )
            printf( "%d ", Vec_IntCountEntry(p->vRegClasses, i) );
        printf( "\n" );
    }
*/
    if ( pPars && pPars->fTents )
    {
/*
        int k, Entry, Prev = 1;
        Vec_Int_t * vLimit = Vec_IntAlloc( 1000 );
        Gia_Man_t * pNew = Gia_ManUnrollDup( p, vLimit );
        Abc_Print( 1, "Tents:  " );
        Vec_IntForEachEntryStart( vLimit, Entry, k, 1 )
            Abc_Print( 1, "%d=%d  ", k, Entry-Prev ), Prev = Entry;
        Abc_Print( 1, " Unused=%d.", Gia_ManObjNum(p) - Gia_ManObjNum(pNew) );
        Abc_Print( 1, "\n" );
        Vec_IntFree( vLimit );
        Gia_ManStop( pNew );
*/
        Gia_ManPrintTents( p );
    }
}